

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer.cpp
# Opt level: O0

io_service * __thiscall booster::aio::deadline_timer::get_io_service(deadline_timer *this)

{
  undefined8 uVar1;
  long in_RDI;
  system_error *unaff_retaddr;
  error_category *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 8) == 0) {
    uVar1 = __cxa_allocate_exception(0x40);
    system::system_error::system_error
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffff0);
    __cxa_throw(uVar1,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return *(io_service **)(in_RDI + 8);
}

Assistant:

io_service &deadline_timer::get_io_service()
{
	if(!srv_)
		throw system::system_error(aio_error::no_service_provided,aio_error_cat);
	return *srv_;
}